

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib583.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  char *pcVar7;
  undefined8 uVar8;
  int stillRunning;
  int local_2c;
  
  iVar1 = curl_global_init(3);
  uVar8 = _stderr;
  if (iVar1 != 0) {
    uVar3 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar8,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                  ,0x28,iVar1,uVar3);
    return iVar1;
  }
  lVar4 = curl_multi_init();
  if (lVar4 == 0) {
    lVar5 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                  ,0x2a);
    iVar1 = 0x7b;
  }
  else {
    lVar5 = curl_easy_init();
    if (lVar5 == 0) {
      lVar5 = 0;
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                    ,0x2c);
      iVar1 = 0x7c;
    }
    else {
      iVar1 = curl_easy_setopt(lVar5,0x2715,libtest_arg2);
      uVar8 = _stderr;
      if (iVar1 == 0) {
        iVar1 = curl_easy_setopt(lVar5,0x27a8,"curl_client_key.pub");
        uVar8 = _stderr;
        if (iVar1 == 0) {
          iVar1 = curl_easy_setopt(lVar5,0x27a9,"curl_client_key");
          uVar8 = _stderr;
          if (iVar1 == 0) {
            iVar1 = curl_easy_setopt(lVar5,0x2e,1);
            uVar8 = _stderr;
            if (iVar1 == 0) {
              iVar1 = curl_easy_setopt(lVar5,0x29,1);
              uVar8 = _stderr;
              if (iVar1 == 0) {
                iVar1 = curl_easy_setopt(lVar5,0x2712,URL);
                uVar8 = _stderr;
                if (iVar1 == 0) {
                  iVar1 = curl_easy_setopt(lVar5,0xe,5);
                  uVar8 = _stderr;
                  if (iVar1 == 0) {
                    iVar1 = curl_multi_add_handle(lVar4,lVar5);
                    uVar8 = _stderr;
                    if (iVar1 == 0) {
                      curl_mfprintf(_stderr,"curl_multi_perform()...\n");
                      iVar1 = curl_multi_perform(lVar4,&local_2c);
                      uVar8 = _stderr;
                      if (iVar1 == 0) {
                        if (local_2c < 0) {
                          curl_mfprintf(_stderr,
                                        "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                                        ,0x3f);
                          iVar1 = 0x7a;
                        }
                        else {
                          iVar1 = 0;
                          curl_mfprintf(_stderr,"curl_multi_perform() succeeded\n");
                          curl_mfprintf(_stderr,"curl_multi_remove_handle()...\n");
                          iVar2 = curl_multi_remove_handle(lVar4,lVar5);
                          if (iVar2 == 0) {
                            curl_mfprintf(_stderr,"curl_multi_remove_handle() succeeded\n");
                          }
                          else {
                            curl_mfprintf(_stderr,
                                          "curl_multi_remove_handle() failed, with code %d\n",iVar2)
                            ;
                            iVar1 = iVar2;
                          }
                        }
                        goto LAB_00101596;
                      }
                      uVar3 = curl_multi_strerror(iVar1);
                      pcVar7 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
                      uVar6 = 0x3f;
                    }
                    else {
                      uVar3 = curl_multi_strerror(iVar1);
                      pcVar7 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
                      uVar6 = 0x38;
                    }
                  }
                  else {
                    uVar3 = curl_easy_strerror(iVar1);
                    pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                    uVar6 = 0x36;
                  }
                }
                else {
                  uVar3 = curl_easy_strerror(iVar1);
                  pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                  uVar6 = 0x35;
                }
              }
              else {
                uVar3 = curl_easy_strerror(iVar1);
                pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                uVar6 = 0x33;
              }
            }
            else {
              uVar3 = curl_easy_strerror(iVar1);
              pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
              uVar6 = 0x32;
            }
          }
          else {
            uVar3 = curl_easy_strerror(iVar1);
            pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
            uVar6 = 0x30;
          }
        }
        else {
          uVar3 = curl_easy_strerror(iVar1);
          pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
          uVar6 = 0x2f;
        }
      }
      else {
        uVar3 = curl_easy_strerror(iVar1);
        pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uVar6 = 0x2e;
      }
      curl_mfprintf(uVar8,pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib583.c"
                    ,uVar6,iVar1,uVar3);
    }
  }
LAB_00101596:
  curl_easy_cleanup(lVar5);
  curl_multi_cleanup(lVar4);
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int test(char *URL)
{
  int stillRunning;
  CURLM *multiHandle = NULL;
  CURL *curl = NULL;
  CURLMcode res = CURLM_OK;

  global_init(CURL_GLOBAL_ALL);

  multi_init(multiHandle);

  easy_init(curl);

  easy_setopt(curl, CURLOPT_USERPWD, libtest_arg2);
  easy_setopt(curl, CURLOPT_SSH_PUBLIC_KEYFILE, "curl_client_key.pub");
  easy_setopt(curl, CURLOPT_SSH_PRIVATE_KEYFILE, "curl_client_key");

  easy_setopt(curl, CURLOPT_UPLOAD, 1L);
  easy_setopt(curl, CURLOPT_VERBOSE, 1L);

  easy_setopt(curl, CURLOPT_URL, URL);
  easy_setopt(curl, CURLOPT_INFILESIZE, (long)5);

  multi_add_handle(multiHandle, curl);

  /* this tests if removing an easy handle immediately after multi
     perform has been called succeeds or not. */

  fprintf(stderr, "curl_multi_perform()...\n");

  multi_perform(multiHandle, &stillRunning);

  fprintf(stderr, "curl_multi_perform() succeeded\n");

  fprintf(stderr, "curl_multi_remove_handle()...\n");
  res = curl_multi_remove_handle(multiHandle, curl);
  if(res)
    fprintf(stderr, "curl_multi_remove_handle() failed, "
            "with code %d\n", (int)res);
  else
    fprintf(stderr, "curl_multi_remove_handle() succeeded\n");

test_cleanup:

  /* undocumented cleanup sequence - type UB */

  curl_easy_cleanup(curl);
  curl_multi_cleanup(multiHandle);
  curl_global_cleanup();

  return (int)res;
}